

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3RowSetNext(RowSet *p,i64 *pRowid)

{
  ushort uVar1;
  RowSetEntry *pRVar2;
  int iVar3;
  
  uVar1 = p->rsFlags;
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) == 0) {
      pRVar2 = rowSetEntrySort(p->pEntry);
      p->pEntry = pRVar2;
      uVar1 = p->rsFlags;
    }
    p->rsFlags = uVar1 | 3;
  }
  pRVar2 = p->pEntry;
  if (pRVar2 == (RowSetEntry *)0x0) {
    iVar3 = 0;
  }
  else {
    *pRowid = pRVar2->v;
    pRVar2 = pRVar2->pRight;
    p->pEntry = pRVar2;
    iVar3 = 1;
    if (pRVar2 == (RowSetEntry *)0x0) {
      sqlite3RowSetClear(p);
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetNext(RowSet *p, i64 *pRowid){
  assert( p!=0 );
  assert( p->pForest==0 );  /* Cannot be used with sqlite3RowSetText() */

  /* Merge the forest into a single sorted list on first call */
  if( (p->rsFlags & ROWSET_NEXT)==0 ){  /*OPTIMIZATION-IF-FALSE*/
    if( (p->rsFlags & ROWSET_SORTED)==0 ){  /*OPTIMIZATION-IF-FALSE*/
      p->pEntry = rowSetEntrySort(p->pEntry);
    }
    p->rsFlags |= ROWSET_SORTED|ROWSET_NEXT;
  }

  /* Return the next entry on the list */
  if( p->pEntry ){
    *pRowid = p->pEntry->v;
    p->pEntry = p->pEntry->pRight;
    if( p->pEntry==0 ){ /*OPTIMIZATION-IF-TRUE*/
      /* Free memory immediately, rather than waiting on sqlite3_finalize() */
      sqlite3RowSetClear(p);
    }
    return 1;
  }else{
    return 0;
  }
}